

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> embree::XMLLoader::load(FileName *fileName,AffineSpace3fa *space)

{
  XMLLoader *in_RDI;
  XMLLoader loader;
  SharedState state;
  SharedState *in_stack_fffffffffffffe20;
  XMLLoader *this;
  XMLLoader *this_00;
  _func_int **local_f0 [28];
  _func_int ***local_10;
  
  this = in_RDI;
  SharedState::SharedState(in_stack_fffffffffffffe20);
  XMLLoader((XMLLoader *)fileName,(FileName *)space,
            (AffineSpace3fa *)state.textureMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
            (SharedState *)state.textureMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  local_10 = local_f0;
  *(_func_int ***)
   &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
       *)&this->path)->_M_t)._M_impl = local_f0[0];
  this_00 = this;
  if (*(_func_int ***)
       &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
           *)&this->path)->_M_t)._M_impl != (_func_int **)0x0) {
    (**(code **)(**(_func_int ***)
                   &(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_embree::Ref<embree::SceneGraph::MaterialNode>_>_>_>
                       *)&this->path)->_M_t)._M_impl + 0x10))();
  }
  ~XMLLoader(this_00);
  SharedState::~SharedState((SharedState *)this);
  return (Ref<embree::SceneGraph::Node>)(Node *)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::load(const FileName& fileName, const AffineSpace3fa& space)
  {
    SharedState state;
    XMLLoader loader(fileName,space,state); return loader.root;
  }